

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Index __thiscall
wabt::interp::
FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>::
New<wabt::interp::HostFunc*>
          (FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
           *this,HostFunc **args)

{
  long *plVar1;
  size_type __n;
  reference rVar2;
  
  if (*(long *)(this + 0x18) == *(long *)(this + 0x20)) {
    if (*(long *)(this + 8) - *(long *)this >> 3 !=
        (ulong)*(uint *)(this + 0x48) + (*(long *)(this + 0x40) - *(long *)(this + 0x30)) * 8) {
      __assert_fail("list_.size() == is_free_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x98,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::HostFunc *>]"
                   );
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),false);
    std::
    vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
    ::emplace_back<wabt::interp::HostFunc*>
              ((vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
                *)this,args);
    __n = (*(long *)(this + 8) - *(long *)this >> 3) - 1;
  }
  else {
    __n = *(size_type *)(*(long *)(this + 0x20) + -8);
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),__n);
    if ((*rVar2._M_p & rVar2._M_mask) == 0) {
      __assert_fail("is_free_[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x92,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::HostFunc *>]"
                   );
    }
    *(long *)(this + 0x20) = *(long *)(this + 0x20) + -8;
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),__n);
    *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
    plVar1 = *(long **)(*(long *)this + __n * 8);
    *(HostFunc **)(*(long *)this + __n * 8) = *args;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  return __n;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (!free_.empty()) {
    Index index = free_.back();
    assert(is_free_[index]);
    free_.pop_back();
    is_free_[index] = false;
    list_[index] = T(std::forward<Args>(args)...);
    return index;
  }
  assert(list_.size() == is_free_.size());
  is_free_.push_back(false);
  list_.emplace_back(std::forward<Args>(args)...);
  return list_.size() - 1;
}